

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

int lj_cconv_compatptr(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  uint uVar1;
  int iVar2;
  CType *d_00;
  CTInfo squal;
  CTInfo dqual;
  
  if (d == s || (flags & 1) != 0) {
    return 1;
  }
  dqual = 0;
  squal = 0;
  d_00 = cconv_childqual(cts,d,&dqual);
  if ((s->info & 0xf0000000) != 0x10000000) {
    s = cconv_childqual(cts,s,&squal);
  }
  if ((flags & 4) == 0) {
    if ((flags & 8) == 0) {
      if ((squal & ~dqual) != 0) {
        return 0;
      }
      if ((d_00->info & 0xf0000000) == 0x40000000) {
        return 1;
      }
      if ((s->info & 0xf0000000) == 0x40000000) {
        return 1;
      }
    }
  }
  else if (dqual != squal) {
    return 0;
  }
  uVar1 = d_00->info;
  iVar2 = 0;
  if ((uVar1 >> 0x1c == s->info >> 0x1c) && (d_00->size == s->size)) {
    if (uVar1 < 0x10000000) {
      if (((s->info ^ uVar1) & 0xc000000) == 0) {
        return 1;
      }
    }
    else if ((uVar1 & 0xe0000000) == 0x20000000) {
      iVar2 = lj_cconv_compatptr(cts,d_00,s,flags | 4);
    }
    else if (d_00 == s || uVar1 >> 0x1c != 1) {
      return 1;
    }
  }
  return iVar2;
}

Assistant:

int lj_cconv_compatptr(CTState *cts, CType *d, CType *s, CTInfo flags)
{
  if (!((flags & CCF_CAST) || d == s)) {
    CTInfo dqual = 0, squal = 0;
    d = cconv_childqual(cts, d, &dqual);
    if (!ctype_isstruct(s->info))
      s = cconv_childqual(cts, s, &squal);
    if ((flags & CCF_SAME)) {
      if (dqual != squal)
	return 0;  /* Different qualifiers. */
    } else if (!(flags & CCF_IGNQUAL)) {
      if ((dqual & squal) != squal)
	return 0;  /* Discarded qualifiers. */
      if (ctype_isvoid(d->info) || ctype_isvoid(s->info))
	return 1;  /* Converting to/from void * is always ok. */
    }
    if (ctype_type(d->info) != ctype_type(s->info) ||
	d->size != s->size)
      return 0;  /* Different type or different size. */
    if (ctype_isnum(d->info)) {
      if (((d->info ^ s->info) & (CTF_BOOL|CTF_FP)))
	return 0;  /* Different numeric types. */
    } else if (ctype_ispointer(d->info)) {
      /* Check child types for compatibility. */
      return lj_cconv_compatptr(cts, d, s, flags|CCF_SAME);
    } else if (ctype_isstruct(d->info)) {
      if (d != s)
	return 0;  /* Must be exact same type for struct/union. */
    } else if (ctype_isfunc(d->info)) {
      /* NYI: structural equality of functions. */
    }
  }
  return 1;  /* Types are compatible. */
}